

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  U32 rawStat;
  int iVar2;
  bool bVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  uint uVar6;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,litLength);
  uVar6 = 0x800;
  if (((int)plVar5[0xc] != 2) && (uVar6 = 0x600, (int)plVar5[10] != 1)) {
    uVar6 = *(uint *)(plVar5 + 8);
    if (uVar6 < 0x100) {
      __assert_fail("optPtr->litSumBasePrice >= BITCOST_MULTIPLIER",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x803b,
                    "U32 ZSTD_rawLiteralsCost(const BYTE *const, const U32, const optState_t *const, int)"
                   );
    }
    uVar1 = uVar6 - 0x100;
    bVar3 = true;
    while (bVar3) {
      rawStat = *(U32 *)(*plVar5 + (ulong)*literals * 4);
      if ((int)optPtr == 0) {
        uVar4 = rawStat + 1;
        iVar2 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar4 = iVar2 << 8;
      }
      else {
        uVar4 = ZSTD_fracWeight(rawStat);
      }
      if (uVar1 < uVar4) {
        uVar4 = uVar1;
      }
      uVar6 = uVar6 - uVar4;
      bVar3 = false;
    }
  }
  return uVar6;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    if (litLength == 0) return 0;

    if (!ZSTD_compressedLiterals(optPtr))
        return (litLength << 3) * BITCOST_MULTIPLIER;  /* Uncompressed - 8 bytes per literal. */

    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = optPtr->litSumBasePrice * litLength;
        U32 const litPriceMax = optPtr->litSumBasePrice - BITCOST_MULTIPLIER;
        U32 u;
        assert(optPtr->litSumBasePrice >= BITCOST_MULTIPLIER);
        for (u=0; u < litLength; u++) {
            U32 litPrice = WEIGHT(optPtr->litFreq[literals[u]], optLevel);
            if (UNLIKELY(litPrice > litPriceMax)) litPrice = litPriceMax;
            price -= litPrice;
        }
        return price;
    }
}